

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcOpenShell::~IfcOpenShell(IfcOpenShell *this)

{
  ~IfcOpenShell((IfcOpenShell *)&this[-1].super_IfcConnectedFaceSet.field_0x50);
  return;
}

Assistant:

IfcOpenShell() : Object("IfcOpenShell") {}